

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi_ptr.hpp
# Opt level: O1

void __thiscall
AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>::reset
          (AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_> *this,OPNChipBase *p)

{
  OPNChipBase *pOVar1;
  size_t *psVar2;
  
  pOVar1 = this->m_p;
  if (pOVar1 != p) {
    if (pOVar1 != (OPNChipBase *)0x0) {
      psVar2 = this->m_counter;
      *psVar2 = *psVar2 - 1;
      if (*psVar2 == 0) {
        (*pOVar1->_vptr_OPNChipBase[1])();
        if (p == (OPNChipBase *)0x0) {
          if (this->m_counter != (size_t *)0x0) {
            operator_delete(this->m_counter);
          }
          this->m_counter = (size_t *)0x0;
        }
      }
    }
    this->m_p = p;
    if (p != (OPNChipBase *)0x0) {
      if (this->m_counter == (size_t *)0x0) {
        psVar2 = (size_t *)operator_new(8);
        this->m_counter = psVar2;
      }
      *this->m_counter = 1;
    }
  }
  return;
}

Assistant:

void reset(T *p = NULL)
    {
        if(p != m_p) {
            if(m_p && --*m_counter == 0) {
                Deleter del;
                del(m_p);
                if(!p) {
                    delete m_counter;
                    m_counter = NULL;
                }
            }
            m_p = p;
            if(p) {
                if(!m_counter)
                    m_counter = new size_t;
                *m_counter = 1;
            }
        }
    }